

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_ClosedEnumError_Test::TestBody
          (PhpGeneratorTest_ClosedEnumError_Test *this)

{
  string_view name;
  string_view command;
  string_view expected_substring;
  string_view contents;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "\n    syntax = \"proto2\";\n    enum Foo {\n      BAR = 0;\n    }";
  contents._M_len = 0x3b;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  command._M_str = "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto";
  command._M_len = 0x42;
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,command);
  expected_substring._M_str = "Can\'t generate PHP code for closed enum Foo";
  expected_substring._M_len = 0x2b;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, ClosedEnumError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    enum Foo {
      BAR = 0;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectErrorSubstring("Can't generate PHP code for closed enum Foo");
}